

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O1

void __thiscall
GdlRuleTable::CheckTablesAndPasses
          (GdlRuleTable *this,GrcManager *pcman,int *pnPassNum,int *pipassBidi)

{
  uint uVar1;
  pointer ppGVar2;
  GdlRenderer *pGVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  GdlPass *pGVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  uint __val;
  uint __len;
  string staPass;
  long *local_260;
  uint local_258;
  undefined4 uStack_254;
  long local_250 [2];
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  GrcManager *local_a0;
  int *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  ppGVar2 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_a0 = pcman;
  local_98 = pnPassNum;
  if ((8 < (ulong)((long)(this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2)) &&
     (pGVar8 = *ppGVar2,
     *(pointer *)
      ((long)&(pGVar8->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl +
      8) != (pGVar8->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
            super__Vector_impl_data._M_start)) {
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_50,this->m_psymName);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               " table is multi-pass, so all rules must be explicitly placed in a pass","");
    GrcErrorList::AddItem
              (&g_errorList,true,0xc1e,&this->super_GdlObject,(GrpLineAndFile *)0x0,&local_50,
               &local_70,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
               (string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      local_260 = local_250;
      cVar6 = '\x01';
      __val = (uint)uVar10;
      if (9 < __val) {
        uVar11 = uVar10;
        cVar5 = '\x04';
        do {
          cVar6 = cVar5;
          uVar9 = (uint)uVar11;
          if (uVar9 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_001378e1;
          }
          if (uVar9 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_001378e1;
          }
          if (uVar9 < 10000) goto LAB_001378e1;
          uVar11 = uVar11 / 10000;
          cVar5 = cVar6 + '\x04';
        } while (99999 < uVar9);
        cVar6 = cVar6 + '\x01';
      }
LAB_001378e1:
      std::__cxx11::string::_M_construct((ulong)&local_260,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_260,local_258,__val);
      pGVar8 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      if ((*(pointer *)
            ((long)&(pGVar8->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>.
                    _M_impl + 8) ==
           (pGVar8->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
           super__Vector_impl_data._M_start) && (pGVar8->m_nCollisionFix < 1)) {
        if (__val != 0) {
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Pass ","");
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,local_260,(long)local_260 + CONCAT44(uStack_254,local_258)
                    );
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_200," of ","");
          GrcSymbolTableEntry::FullName_abi_cxx11_(&local_90,this->m_psymName);
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100," table contains no rules","");
          GrcErrorList::AddItem
                    (&g_errorList,false,0xdaf,&this->super_GdlObject,(GrpLineAndFile *)0x0,
                     &local_1e0,&local_240,&local_200,&local_90,&local_100,(string *)0x0,
                     (string *)0x0,(string *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          pGVar8 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10];
        }
        pGVar8->m_nGlobalID = -1;
      }
      else {
        pGVar8->m_nGlobalID = *local_98;
        *local_98 = *local_98 + 1;
        uVar9 = pGVar8->m_nDir;
        if (uVar9 < 3) {
          pGVar3 = local_a0->m_prndr;
          uVar1 = pGVar3->m_grfsdc;
          if ((uVar9 == 0) || (0xfffffffd < uVar1 - 3)) {
            if ((uVar9 == 0) || (uVar1 != uVar9)) {
              if (uVar9 != 0) {
                pGVar8->m_fFlipDir = true;
                pGVar3->m_fHasFlippedPass = 1;
              }
            }
            else {
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a0,"Direction of pass ","");
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c0,local_260,
                         (long)local_260 + CONCAT44(uStack_254,local_258));
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,
                         " matches font\'s ScriptDirection and will have no effect ","");
              GrcErrorList::AddItem
                        (&g_errorList,false,0xdd3,&this->super_GdlObject,(GrpLineAndFile *)0x0,
                         &local_1a0,&local_1c0,&local_e0,(string *)0x0,(string *)0x0,(string *)0x0,
                         (string *)0x0,(string *)0x0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              uVar12 = local_1a0.field_2._M_allocated_capacity;
              _Var13._M_p = local_1a0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) goto LAB_00137fa5;
            }
          }
          else {
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_140,"Direction directive invalid (on pass ","");
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,local_260,
                       (long)local_260 + CONCAT44(uStack_254,local_258));
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,") due to font ScriptDirection setting of ","");
            uVar9 = -uVar1;
            if (0 < (int)uVar1) {
              uVar9 = uVar1;
            }
            __len = 1;
            if (9 < uVar9) {
              uVar10 = (ulong)uVar9;
              uVar4 = 4;
              do {
                __len = uVar4;
                uVar7 = (uint)uVar10;
                if (uVar7 < 100) {
                  __len = __len - 2;
                  goto LAB_00137e84;
                }
                if (uVar7 < 1000) {
                  __len = __len - 1;
                  goto LAB_00137e84;
                }
                if (uVar7 < 10000) goto LAB_00137e84;
                uVar10 = uVar10 / 10000;
                uVar4 = __len + 4;
              } while (99999 < uVar7);
              __len = __len + 1;
            }
LAB_00137e84:
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_220,(char)__len - (char)((int)uVar1 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_220._M_dataplus._M_p + (uVar1 >> 0x1f),__len,uVar9);
            GrcErrorList::AddItem
                      (&g_errorList,true,0xc5f,&this->super_GdlObject,(GrpLineAndFile *)0x0,
                       &local_140,&local_160,&local_180,&local_220,(string *)0x0,(string *)0x0,
                       (string *)0x0,(string *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            uVar12 = local_140.field_2._M_allocated_capacity;
            _Var13._M_p = local_140._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) goto LAB_00137fa5;
          }
        }
        else {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"Invalid direction for pass ","");
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_260,(long)local_260 + CONCAT44(uStack_254,local_258))
          ;
          GrcErrorList::AddItem
                    (&g_errorList,true,0xc5e,&this->super_GdlObject,(GrpLineAndFile *)0x0,&local_120
                     ,&local_c0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                     (string *)0x0,(string *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          uVar12 = local_120.field_2._M_allocated_capacity;
          _Var13._M_p = local_120._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
LAB_00137fa5:
            operator_delete(_Var13._M_p,uVar12 + 1);
          }
        }
      }
      if (local_260 != local_250) {
        operator_delete(local_260,local_250[0] + 1);
      }
      uVar10 = (ulong)(__val + 1);
    } while (uVar10 < (ulong)((long)(this->m_vppass).
                                    super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_vppass).
                                    super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void GdlRuleTable::CheckTablesAndPasses(GrcManager * pcman, int *pnPassNum, int *pipassBidi)
{
	if (m_vppass.size() > 1 && m_vppass[0]->HasRules())
	{
		g_errorList.AddError(3102, this,
			m_psymName->FullName(),
			" table is multi-pass, so all rules must be explicitly placed in a pass");

		// but go ahead and treat it as the zeroth pass for now
	}

	for (auto ipass = 0U; ipass < m_vppass.size(); ++ipass)
	{
		auto const staPass = std::to_string(ipass);
		if (m_vppass[ipass]->ValidPass())
		{
			m_vppass[ipass]->AssignGlobalID(*pnPassNum);
			(*pnPassNum)++;

			int fsdcPassDir = m_vppass[ipass]->Direction();
			int fsdcScriptDir = pcman->Renderer()->ScriptDirections();
			if (fsdcPassDir != kfsdcNone && fsdcPassDir != kfsdcHorizLtr && fsdcPassDir != kfsdcHorizRtl)
			{
				g_errorList.AddError(3166, this,
					"Invalid direction for pass ",
					staPass);
			}
			else if (fsdcPassDir != kfsdcNone && fsdcScriptDir != kfsdcHorizLtr && fsdcScriptDir != kfsdcHorizRtl)
			{
				g_errorList.AddError(3167, this,
					"Direction directive invalid (on pass ",
					staPass,
					") due to font ScriptDirection setting of ",
					std::to_string(fsdcScriptDir));
			}
			else if (fsdcPassDir != kfsdcNone && fsdcScriptDir == fsdcPassDir)
			{
				g_errorList.AddWarning(3539, this,
					"Direction of pass ",
					staPass,
					" matches font's ScriptDirection and will have no effect ");
			}
			else
			{
				Assert(fsdcScriptDir >= kfsdcNone);
				Assert(fsdcScriptDir <= kfsdcHorizRtl);
				if (fsdcPassDir > kfsdcNone)
				{
					Assert(fsdcScriptDir != fsdcPassDir);
					m_vppass[ipass]->SetFlipDirection(true);
					pcman->Renderer()->SetHasFlippedPass(true);
				}
			}
		}
		else if (ipass == 0)
		{
			// okay--zeroth pass *should* be empty if there are other passes
			m_vppass[ipass]->AssignGlobalID(-1);
		}
		else
		{
			g_errorList.AddWarning(3503, this,
				"Pass ",
				staPass,
				" of ",
				m_psymName->FullName(),
				" table contains no rules");
			m_vppass[ipass]->AssignGlobalID(-1);
		}
	}
}